

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *p,Ivy_Obj_t *pOld,Ivy_Obj_t *pNew)

{
  uint uVar1;
  uint uVar2;
  Ivy_Obj_t *pNode;
  int iVar3;
  Vec_Ptr_t *vFrontier;
  void **ppvVar4;
  Ivy_Obj_t *vSuper;
  ulong *puVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  if (pOld == (Ivy_Obj_t *)0x0 && pNew == (Ivy_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x9f6,"void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)"
                 );
  }
  if (((pOld == (Ivy_Obj_t *)0x0) || (pOld->pNextFan1 != (Ivy_Obj_t *)0x0)) &&
     ((pNew == (Ivy_Obj_t *)0x0 || (pNew->pNextFan1 != (Ivy_Obj_t *)0x0)))) {
    return;
  }
  vFrontier = (Vec_Ptr_t *)malloc(0x10);
  vFrontier->nCap = 100;
  vFrontier->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vFrontier->pArray = ppvVar4;
  if (pOld != (Ivy_Obj_t *)0x0) {
    Ivy_FraigObjAddToFrontier(p,pOld,vFrontier);
  }
  if (pNew != (Ivy_Obj_t *)0x0) {
    Ivy_FraigObjAddToFrontier(p,pNew,vFrontier);
  }
  if (0 < vFrontier->nSize) {
    lVar9 = 0;
    do {
      pNode = (Ivy_Obj_t *)vFrontier->pArray[lVar9];
      if (*(int *)&pNode->pNextFan0 == 0) {
        __assert_fail("Ivy_ObjSatNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa02,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      if (pNode->pNextFan1 != (Ivy_Obj_t *)0x0) {
        __assert_fail("Ivy_ObjFaninVec(pNode) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa03,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      iVar3 = Ivy_ObjIsMuxType(pNode);
      if (iVar3 == 0) {
        vSuper = (Ivy_Obj_t *)Ivy_FraigCollectSuper(pNode,1);
        if (0 < vSuper->TravId) {
          lVar7 = 0;
          do {
            Ivy_FraigObjAddToFrontier
                      (p,(Ivy_Obj_t *)
                         (*(ulong *)(*(long *)&vSuper->field_0x8 + lVar7 * 8) & 0xfffffffffffffffe),
                       vFrontier);
            lVar7 = lVar7 + 1;
          } while (lVar7 < vSuper->TravId);
        }
        Ivy_FraigAddClausesSuper(p,pNode,(Vec_Ptr_t *)vSuper);
      }
      else {
        vSuper = (Ivy_Obj_t *)malloc(0x10);
        vSuper->Id = 8;
        vSuper->TravId = 0;
        puVar5 = (ulong *)malloc(0x40);
        *(ulong **)&vSuper->field_0x8 = puVar5;
        uVar8 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10);
        vSuper->TravId = 1;
        *puVar5 = uVar8 & 0xfffffffffffffffe;
        uVar8 = *(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) & 0xfffffffffffffffe
        ;
        uVar1 = vSuper->TravId;
        if (0 < (long)(int)uVar1) {
          lVar7 = 0;
          do {
            if (*(ulong *)(*(long *)&vSuper->field_0x8 + lVar7 * 8) == uVar8) goto LAB_007d7778;
            lVar7 = lVar7 + 1;
          } while ((int)uVar1 != lVar7);
        }
        uVar2 = vSuper->Id;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (*(void **)&vSuper->field_0x8 == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)&vSuper->field_0x8,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar2 * 2;
            if (iVar3 <= (int)uVar2) goto LAB_007d7762;
            if (*(void **)&vSuper->field_0x8 == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar2 << 4);
            }
            else {
              pvVar6 = realloc(*(void **)&vSuper->field_0x8,(ulong)uVar2 << 4);
            }
          }
          *(void **)&vSuper->field_0x8 = pvVar6;
          vSuper->Id = iVar3;
        }
LAB_007d7762:
        iVar3 = vSuper->TravId;
        vSuper->TravId = iVar3 + 1;
        *(ulong *)(*(long *)&vSuper->field_0x8 + (long)iVar3 * 8) = uVar8;
LAB_007d7778:
        uVar8 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x18) & 0xfffffffffffffffe
        ;
        uVar1 = vSuper->TravId;
        if (0 < (long)(int)uVar1) {
          lVar7 = 0;
          do {
            if (*(ulong *)(*(long *)&vSuper->field_0x8 + lVar7 * 8) == uVar8) goto LAB_007d7826;
            lVar7 = lVar7 + 1;
          } while ((int)uVar1 != lVar7);
        }
        uVar2 = vSuper->Id;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (*(void **)&vSuper->field_0x8 == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)&vSuper->field_0x8,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar2 * 2;
            if (iVar3 <= (int)uVar2) goto LAB_007d7810;
            if (*(void **)&vSuper->field_0x8 == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar2 << 4);
            }
            else {
              pvVar6 = realloc(*(void **)&vSuper->field_0x8,(ulong)uVar2 << 4);
            }
          }
          *(void **)&vSuper->field_0x8 = pvVar6;
          vSuper->Id = iVar3;
        }
LAB_007d7810:
        iVar3 = vSuper->TravId;
        vSuper->TravId = iVar3 + 1;
        *(ulong *)(*(long *)&vSuper->field_0x8 + (long)iVar3 * 8) = uVar8;
LAB_007d7826:
        uVar8 = *(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x18) & 0xfffffffffffffffe
        ;
        uVar1 = vSuper->TravId;
        if (0 < (long)(int)uVar1) {
          lVar7 = 0;
          do {
            if (*(ulong *)(*(long *)&vSuper->field_0x8 + lVar7 * 8) == uVar8) goto LAB_007d78d4;
            lVar7 = lVar7 + 1;
          } while ((int)uVar1 != lVar7);
        }
        uVar2 = vSuper->Id;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (*(void **)&vSuper->field_0x8 == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)&vSuper->field_0x8,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar2 * 2;
            if (iVar3 <= (int)uVar2) goto LAB_007d78be;
            if (*(void **)&vSuper->field_0x8 == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar2 << 4);
            }
            else {
              pvVar6 = realloc(*(void **)&vSuper->field_0x8,(ulong)uVar2 << 4);
            }
          }
          *(void **)&vSuper->field_0x8 = pvVar6;
          vSuper->Id = iVar3;
        }
LAB_007d78be:
        iVar3 = vSuper->TravId;
        vSuper->TravId = iVar3 + 1;
        *(ulong *)(*(long *)&vSuper->field_0x8 + (long)iVar3 * 8) = uVar8;
LAB_007d78d4:
        if (0 < vSuper->TravId) {
          lVar7 = 0;
          do {
            Ivy_FraigObjAddToFrontier
                      (p,(Ivy_Obj_t *)
                         (*(ulong *)(*(long *)&vSuper->field_0x8 + lVar7 * 8) & 0xfffffffffffffffe),
                       vFrontier);
            lVar7 = lVar7 + 1;
          } while (lVar7 < vSuper->TravId);
        }
        Ivy_FraigAddClausesMux(p,pNode);
      }
      if (vSuper->TravId < 2) {
        __assert_fail("Vec_PtrSize(vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa16,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      pNode->pNextFan1 = vSuper;
      lVar9 = lVar9 + 1;
    } while (lVar9 < vFrontier->nSize);
  }
  if (vFrontier->pArray != (void **)0x0) {
    free(vFrontier->pArray);
    vFrontier->pArray = (void **)0x0;
  }
  free(vFrontier);
  sat_solver_simplify(p->pSat);
  return;
}

Assistant:

void Ivy_FraigNodeAddToSolver( Ivy_FraigMan_t * p, Ivy_Obj_t * pOld, Ivy_Obj_t * pNew )
{ 
    Vec_Ptr_t * vFrontier, * vFanins;
    Ivy_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    assert( pOld || pNew );
    // quit if CNF is ready
    if ( (!pOld || Ivy_ObjFaninVec(pOld)) && (!pNew || Ivy_ObjFaninVec(pNew)) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    if ( pOld ) Ivy_FraigObjAddToFrontier( p, pOld, vFrontier );
    if ( pNew ) Ivy_FraigObjAddToFrontier( p, pNew, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Ivy_ObjSatNum(pNode) );
        assert( Ivy_ObjFaninVec(pNode) == NULL );
        if ( fUseMuxes && Ivy_ObjIsMuxType(pNode) )
        {
            vFanins = Vec_PtrAlloc( 4 );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin0( Ivy_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin0( Ivy_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin1( Ivy_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin1( Ivy_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, k )
                Ivy_FraigObjAddToFrontier( p, Ivy_Regular(pFanin), vFrontier );
            Ivy_FraigAddClausesMux( p, pNode );
        }
        else
        {
            vFanins = Ivy_FraigCollectSuper( pNode, fUseMuxes );
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, k )
                Ivy_FraigObjAddToFrontier( p, Ivy_Regular(pFanin), vFrontier );
            Ivy_FraigAddClausesSuper( p, pNode, vFanins );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
        Ivy_ObjSetFaninVec( pNode, vFanins );
    }
    Vec_PtrFree( vFrontier );
    sat_solver_simplify( p->pSat );
}